

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest_rewriter.cpp
# Opt level: O3

void __thiscall duckdb::UnnestRewriter::GetLHSExpressions(UnnestRewriter *this,LogicalOperator *op)

{
  LogicalProjection *pLVar1;
  pointer pLVar2;
  reference __args;
  reference __args_1;
  reference this_00;
  reference pvVar3;
  pointer pLVar4;
  size_type __n;
  bool bVar5;
  vector<duckdb::ColumnBinding,_true> col_bindings;
  vector<duckdb::ColumnBinding,_true> local_48;
  
  LogicalOperator::ResolveOperatorTypes(op);
  (*op->_vptr_LogicalOperator[2])(&local_48,op);
  if (op->type == LOGICAL_PROJECTION) {
    pLVar1 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
    pLVar2 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar4 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar5 = (long)(pLVar1->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pLVar1->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 ==
            ((long)pLVar4 - (long)pLVar2 >> 3) * -0x5555555555555555;
  }
  else {
    pLVar2 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar4 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar5 = false;
  }
  if (pLVar4 != pLVar2) {
    __n = 0;
    do {
      __args = vector<duckdb::ColumnBinding,_true>::operator[](&local_48,__n);
      __args_1 = vector<duckdb::LogicalType,_true>::operator[](&op->types,__n);
      ::std::vector<duckdb::LHSBinding,std::allocator<duckdb::LHSBinding>>::
      emplace_back<duckdb::ColumnBinding&,duckdb::LogicalType&>
                ((vector<duckdb::LHSBinding,std::allocator<duckdb::LHSBinding>> *)
                 &this->lhs_bindings,__args,__args_1);
      if (bVar5) {
        pLVar1 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&(pLVar1->super_LogicalOperator).expressions,__n);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  (this_00);
        pvVar3 = vector<duckdb::LHSBinding,_true>::back(&this->lhs_bindings);
        ::std::__cxx11::string::_M_assign((string *)&pvVar3->alias);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(op->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(op->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  if (local_48.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void UnnestRewriter::GetLHSExpressions(LogicalOperator &op) {

	op.ResolveOperatorTypes();
	auto col_bindings = op.GetColumnBindings();
	D_ASSERT(op.types.size() == col_bindings.size());

	bool set_alias = false;
	// we can easily extract the alias for LOGICAL_PROJECTION(s)
	if (op.type == LogicalOperatorType::LOGICAL_PROJECTION) {
		auto &proj = op.Cast<LogicalProjection>();
		if (proj.expressions.size() == op.types.size()) {
			set_alias = true;
		}
	}

	for (idx_t i = 0; i < op.types.size(); i++) {
		lhs_bindings.emplace_back(col_bindings[i], op.types[i]);
		if (set_alias) {
			auto &proj = op.Cast<LogicalProjection>();
			lhs_bindings.back().alias = proj.expressions[i]->GetAlias();
		}
	}
}